

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

uint Kit_GraphToTruth(Kit_Graph_t *pGraph)

{
  uint uVar1;
  Kit_Edge_t KVar2;
  Kit_Node_t *pKVar3;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  uVar1 = pGraph->nLeaves;
  if ((int)uVar1 < 0) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitGraph.c"
                  ,0x13a,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  iVar6 = pGraph->nSize;
  if ((int)uVar1 <= iVar6) {
    if (uVar1 < 6) {
      KVar2 = pGraph->eRoot;
      if (pGraph->fConst == 0) {
        uVar4 = (uint)KVar2 >> 1 & 0x3fffffff;
        if (uVar4 < uVar1) {
          uVar4 = -((uint)KVar2 & 1) ^ (&DAT_00a13160)[uVar4];
        }
        else {
          uVar4 = 0;
          iVar9 = 0;
          if (uVar1 != 0) {
            puVar5 = &DAT_00a13160;
            lVar7 = 2;
            lVar8 = 0;
            do {
              *(ulong *)(&pGraph->pNodes->eEdge0 + lVar7) = (ulong)*puVar5;
              lVar8 = lVar8 + 1;
              iVar9 = pGraph->nLeaves;
              puVar5 = puVar5 + 1;
              lVar7 = lVar7 + 6;
            } while (lVar8 < iVar9);
            iVar6 = pGraph->nSize;
          }
          if (iVar9 < iVar6) {
            lVar8 = (long)iVar9;
            lVar7 = lVar8 * 0x18 + 8;
            do {
              pKVar3 = pGraph->pNodes;
              uVar1 = *(uint *)((long)pKVar3 + lVar7 + -8);
              uVar4 = *(uint *)((long)pKVar3 + lVar7 + -4);
              uVar4 = (-(uVar4 & 1) ^ pKVar3[uVar4 >> 1 & 0x3fffffff].field_2.iFunc) &
                      (-(uVar1 & 1) ^ pKVar3[uVar1 >> 1 & 0x3fffffff].field_2.iFunc);
              *(ulong *)(&(pKVar3->eEdge0).field_0x0 + lVar7) = (ulong)uVar4;
              lVar8 = lVar8 + 1;
              lVar7 = lVar7 + 0x18;
            } while (lVar8 < pGraph->nSize);
          }
          uVar4 = -((uint)pGraph->eRoot & 1) ^ uVar4;
        }
      }
      else {
        uVar4 = ((uint)KVar2 & 1) - 1;
      }
      return uVar4;
    }
    __assert_fail("Kit_GraphLeaveNum(pGraph) <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitGraph.c"
                  ,0x13c,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  __assert_fail("Kit_GraphLeaveNum(pGraph) <= pGraph->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitGraph.c"
                ,0x13b,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
}

Assistant:

unsigned Kit_GraphToTruth( Kit_Graph_t * pGraph )
{
    unsigned uTruths[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth = 0, uTruth0, uTruth1;
    Kit_Node_t * pNode;
    int i;

    // sanity checks
    assert( Kit_GraphLeaveNum(pGraph) >= 0 );
    assert( Kit_GraphLeaveNum(pGraph) <= pGraph->nSize );
    assert( Kit_GraphLeaveNum(pGraph) <= 5 );

    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Kit_GraphIsComplement(pGraph)? 0 : ~((unsigned)0);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Kit_GraphIsComplement(pGraph)? ~uTruths[Kit_GraphVarInt(pGraph)] : uTruths[Kit_GraphVarInt(pGraph)];

    // assign the elementary variables
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = (void *)(long)uTruths[i];

    // compute the function for each internal node
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        uTruth0 = (unsigned)(long)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc;
        uTruth1 = (unsigned)(long)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc;
        uTruth0 = pNode->eEdge0.fCompl? ~uTruth0 : uTruth0;
        uTruth1 = pNode->eEdge1.fCompl? ~uTruth1 : uTruth1;
        uTruth = uTruth0 & uTruth1;
        pNode->pFunc = (void *)(long)uTruth;
    }

    // complement the result if necessary
    return Kit_GraphIsComplement(pGraph)? ~uTruth : uTruth;
}